

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::operator=(QString *this,QChar ch)

{
  QString *pQVar1;
  
  pQVar1 = fill(this,ch,1);
  return pQVar1;
}

Assistant:

QString &QString::operator=(QChar ch)
{
    return assign(1, ch);
}